

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedBarrStart(word *barr_param,word *mod,size_t n,void *stack)

{
  word *in_RCX;
  long in_RDX;
  size_t in_stack_00000008;
  word *divident;
  void *in_stack_00000040;
  
  wwSetZero(in_RCX,in_RDX << 1);
  in_RCX[in_RDX * 2] = 1;
  zzDiv(barr_param,mod,(word *)n,(size_t)stack,divident,in_stack_00000008,in_stack_00000040);
  return;
}

Assistant:

void zzRedBarrStart(word barr_param[], const word mod[], size_t n, 
	void* stack)
{
	word* divident = (word*)stack;
	stack = divident + 2 * n + 1;
	// pre
	ASSERT(wwIsDisjoint2(barr_param, n + 2, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// divident <- B^{2n}
	wwSetZero(divident, 2 * n);
	divident[2 * n] = 1;
	// barr_param <- divident \div mod
	zzDiv(barr_param, divident, divident, 2 * n + 1, mod, n, stack);
}